

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Geometry *pGVar19;
  RTCIntersectArguments *pRVar20;
  RTCRayQueryContext *pRVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 (*pauVar26) [16];
  int iVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  RayHit *pRVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined8 uVar37;
  undefined4 uVar38;
  ulong unaff_R12;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  Scene *pSVar42;
  float fVar43;
  float fVar60;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar64;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  float fVar79;
  float fVar80;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar93;
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  undefined1 auVar92 [16];
  float fVar96;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar104 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1271;
  ulong local_1270;
  ulong local_1268;
  ulong local_1260;
  undefined1 local_1258 [16];
  RayQueryContext *local_1248;
  undefined1 local_123c [8];
  float fStack_1234;
  undefined4 uStack_1230;
  undefined1 auStack_122c [8];
  uint uStack_1224;
  uint uStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  undefined1 auStack_120c [12];
  void *local_1200;
  RTCRayQueryContext *local_11f8;
  RayHit *local_11f0;
  float *local_11e8;
  undefined4 local_11e0;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  ulong local_11a8;
  ulong local_11a0;
  undefined1 (*local_1198) [16];
  Scene *local_1190;
  long local_1188;
  ulong local_1180;
  float local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  uint local_1160;
  uint local_115c;
  uint local_1158;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [12];
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 *local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  RayHit *pRVar31;
  undefined1 auVar52 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_1198 = (undefined1 (*) [16])local_f68;
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_ff8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar138 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1008 = 0.0;
      if (0.0 <= fVar138) {
        local_1008 = fVar138;
      }
      aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar138 = (ray->super_RayK<1>).tfar;
      fVar81 = 0.0;
      if (0.0 <= fVar138) {
        fVar81 = fVar138;
      }
      auVar118._4_4_ = -(uint)(ABS(aVar10.y) < 1e-18);
      auVar118._0_4_ = -(uint)(ABS(aVar10.x) < 1e-18);
      auVar118._8_4_ = -(uint)(ABS(aVar10.z) < 1e-18);
      auVar118._12_4_ = -(uint)(ABS(aVar10.field_3.w) < 1e-18);
      auVar117 = divps(_DAT_01feca10,(undefined1  [16])aVar10);
      auVar118 = blendvps(auVar117,_DAT_0201c930,auVar118);
      local_1058 = auVar118._0_4_ * 0.99999964;
      local_1068 = auVar118._4_4_ * 0.99999964;
      local_1028 = auVar118._8_4_ * 0.99999964;
      local_1138 = auVar118._0_4_ * 1.0000004;
      local_1148 = auVar118._4_4_ * 1.0000004;
      local_1018 = auVar118._8_4_ * 1.0000004;
      local_11a0 = (ulong)(local_1058 < 0.0) << 4;
      local_11a8 = (ulong)(local_1068 < 0.0) << 4 | 0x20;
      local_1260 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
      local_1268 = local_11a0 ^ 0x10;
      uVar35 = local_11a8 ^ 0x10;
      local_1180 = local_1260 ^ 0x10;
      auVar117._4_4_ = fVar81;
      auVar117._0_4_ = fVar81;
      auVar117._8_4_ = fVar81;
      auVar117._12_4_ = fVar81;
      _local_fe8 = mm_lookupmask_ps._240_8_;
      _uStack_fe0 = mm_lookupmask_ps._248_8_;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1134 = local_1138;
      fStack_1130 = local_1138;
      fStack_112c = local_1138;
      fStack_1144 = local_1148;
      fStack_1140 = local_1148;
      fStack_113c = local_1148;
      uVar30 = local_11a0;
      uVar33 = local_1260;
      uVar34 = local_1268;
      uVar41 = local_11a8;
      fVar138 = local_1008;
      fVar81 = local_1008;
      fVar129 = local_1008;
      fVar64 = local_1008;
      fVar82 = local_1048;
      fVar43 = local_1048;
      fVar60 = local_1048;
      fVar65 = local_1048;
      fVar71 = local_1058;
      fVar72 = local_1058;
      fVar73 = local_1058;
      fVar74 = local_1058;
      fVar79 = local_1068;
      fVar80 = local_1068;
      fVar89 = local_1068;
      fVar93 = local_1068;
      fVar94 = local_1138;
      fVar95 = local_1138;
      fVar96 = local_1138;
      fVar99 = local_1138;
      fVar100 = local_1148;
      fVar101 = local_1148;
      fVar102 = local_1148;
      fVar103 = local_1148;
      fVar105 = local_ff8;
      fVar106 = local_ff8;
      fVar107 = local_ff8;
      fVar108 = local_ff8;
      fVar109 = local_1018;
      fVar110 = local_1018;
      fVar111 = local_1018;
      fVar112 = local_1018;
      fVar113 = local_1028;
      fVar114 = local_1028;
      fVar115 = local_1028;
      fVar116 = local_1028;
      fVar119 = local_1038;
      fVar120 = local_1038;
      fVar121 = local_1038;
      fVar122 = local_1038;
      local_1270 = uVar35;
      local_1248 = context;
      do {
        do {
          do {
            if (local_1198 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar26 = local_1198 + -1;
            local_1198 = local_1198 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar26 + 8));
          uVar40 = *(ulong *)*local_1198;
          do {
            if ((uVar40 & 8) == 0) {
              pfVar8 = (float *)(uVar40 + 0x20 + uVar30);
              auVar84._0_4_ = (*pfVar8 - fVar119) * fVar71;
              auVar84._4_4_ = (pfVar8[1] - fVar120) * fVar72;
              auVar84._8_4_ = (pfVar8[2] - fVar121) * fVar73;
              auVar84._12_4_ = (pfVar8[3] - fVar122) * fVar74;
              pfVar8 = (float *)(uVar40 + 0x20 + uVar41);
              auVar91._0_4_ = (*pfVar8 - fVar82) * fVar79;
              auVar91._4_4_ = (pfVar8[1] - fVar43) * fVar80;
              auVar91._8_4_ = (pfVar8[2] - fVar60) * fVar89;
              auVar91._12_4_ = (pfVar8[3] - fVar65) * fVar93;
              auVar118 = maxps(auVar84,auVar91);
              pfVar8 = (float *)(uVar40 + 0x20 + uVar33);
              auVar66._0_4_ = (*pfVar8 - fVar105) * fVar113;
              auVar66._4_4_ = (pfVar8[1] - fVar106) * fVar114;
              auVar66._8_4_ = (pfVar8[2] - fVar107) * fVar115;
              auVar66._12_4_ = (pfVar8[3] - fVar108) * fVar116;
              auVar67._4_4_ = fVar81;
              auVar67._0_4_ = fVar138;
              auVar67._8_4_ = fVar129;
              auVar67._12_4_ = fVar64;
              auVar67 = maxps(auVar66,auVar67);
              _local_1118 = maxps(auVar118,auVar67);
              pfVar8 = (float *)(uVar40 + 0x20 + uVar34);
              auVar68._0_4_ = (*pfVar8 - fVar119) * fVar94;
              auVar68._4_4_ = (pfVar8[1] - fVar120) * fVar95;
              auVar68._8_4_ = (pfVar8[2] - fVar121) * fVar96;
              auVar68._12_4_ = (pfVar8[3] - fVar122) * fVar99;
              pfVar8 = (float *)(uVar40 + 0x20 + uVar35);
              auVar75._0_4_ = (*pfVar8 - fVar82) * fVar100;
              auVar75._4_4_ = (pfVar8[1] - fVar43) * fVar101;
              auVar75._8_4_ = (pfVar8[2] - fVar60) * fVar102;
              auVar75._12_4_ = (pfVar8[3] - fVar65) * fVar103;
              auVar118 = minps(auVar68,auVar75);
              pfVar8 = (float *)(uVar40 + 0x20 + local_1180);
              auVar76._0_4_ = (*pfVar8 - fVar105) * fVar109;
              auVar76._4_4_ = (pfVar8[1] - fVar106) * fVar110;
              auVar76._8_4_ = (pfVar8[2] - fVar107) * fVar111;
              auVar76._12_4_ = (pfVar8[3] - fVar108) * fVar112;
              auVar67 = minps(auVar76,auVar117);
              auVar118 = minps(auVar118,auVar67);
              auVar87._4_4_ = -(uint)(local_1118._4_4_ <= auVar118._4_4_);
              auVar87._0_4_ = -(uint)(local_1118._0_4_ <= auVar118._0_4_);
              auVar87._8_4_ = -(uint)(local_1118._8_4_ <= auVar118._8_4_);
              auVar87._12_4_ = -(uint)(local_1118._12_4_ <= auVar118._12_4_);
              uVar38 = movmskps((int)unaff_R12,auVar87);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar38);
            }
            if ((uVar40 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar27 = 4;
              }
              else {
                uVar39 = uVar40 & 0xfffffffffffffff0;
                lVar29 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                iVar27 = 0;
                uVar40 = *(ulong *)(uVar39 + lVar29 * 8);
                uVar36 = unaff_R12 - 1 & unaff_R12;
                if (uVar36 != 0) {
                  uVar28 = *(uint *)(local_1118 + lVar29 * 4);
                  lVar29 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  uVar13 = *(ulong *)(uVar39 + lVar29 * 8);
                  uVar11 = *(uint *)(local_1118 + lVar29 * 4);
                  uVar36 = uVar36 - 1 & uVar36;
                  uVar33 = local_1260;
                  uVar34 = local_1268;
                  uVar35 = local_1270;
                  if (uVar36 == 0) {
                    if (uVar28 < uVar11) {
                      *(ulong *)*local_1198 = uVar13;
                      *(uint *)((long)*local_1198 + 8) = uVar11;
                      local_1198 = local_1198 + 1;
                    }
                    else {
                      *(ulong *)*local_1198 = uVar40;
                      *(uint *)((long)*local_1198 + 8) = uVar28;
                      local_1198 = local_1198 + 1;
                      uVar40 = uVar13;
                    }
                  }
                  else {
                    auVar69._8_4_ = uVar28;
                    auVar69._0_8_ = uVar40;
                    auVar69._12_4_ = 0;
                    auVar85._8_4_ = uVar11;
                    auVar85._0_8_ = uVar13;
                    auVar85._12_4_ = 0;
                    lVar29 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                      }
                    }
                    uVar37 = *(undefined8 *)(uVar39 + lVar29 * 8);
                    iVar12 = *(int *)(local_1118 + lVar29 * 4);
                    auVar77._8_4_ = iVar12;
                    auVar77._0_8_ = uVar37;
                    auVar77._12_4_ = 0;
                    auVar44._8_4_ = -(uint)((int)uVar28 < (int)uVar11);
                    uVar36 = uVar36 - 1 & uVar36;
                    if (uVar36 == 0) {
                      auVar44._4_4_ = auVar44._8_4_;
                      auVar44._0_4_ = auVar44._8_4_;
                      auVar44._12_4_ = auVar44._8_4_;
                      auVar83._8_4_ = uVar11;
                      auVar83._0_8_ = uVar13;
                      auVar83._12_4_ = 0;
                      auVar67 = blendvps(auVar83,auVar69,auVar44);
                      auVar118 = blendvps(auVar69,auVar85,auVar44);
                      auVar45._8_4_ = -(uint)(auVar67._8_4_ < iVar12);
                      auVar45._4_4_ = auVar45._8_4_;
                      auVar45._0_4_ = auVar45._8_4_;
                      auVar45._12_4_ = auVar45._8_4_;
                      auVar86._8_4_ = iVar12;
                      auVar86._0_8_ = uVar37;
                      auVar86._12_4_ = 0;
                      auVar87 = blendvps(auVar86,auVar67,auVar45);
                      auVar84 = blendvps(auVar67,auVar77,auVar45);
                      auVar46._8_4_ = -(uint)(auVar118._8_4_ < auVar84._8_4_);
                      auVar46._4_4_ = auVar46._8_4_;
                      auVar46._0_4_ = auVar46._8_4_;
                      auVar46._12_4_ = auVar46._8_4_;
                      auVar67 = blendvps(auVar84,auVar118,auVar46);
                      auVar118 = blendvps(auVar118,auVar84,auVar46);
                      *local_1198 = auVar118;
                      local_1198[1] = auVar67;
                      uVar40 = auVar87._0_8_;
                      local_1198 = local_1198 + 2;
                    }
                    else {
                      lVar29 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                        }
                      }
                      auVar47._4_4_ = auVar44._8_4_;
                      auVar47._0_4_ = auVar44._8_4_;
                      auVar47._8_4_ = auVar44._8_4_;
                      auVar47._12_4_ = auVar44._8_4_;
                      auVar84 = blendvps(auVar85,auVar69,auVar47);
                      auVar118 = blendvps(auVar69,auVar85,auVar47);
                      auVar90._8_4_ = *(int *)(local_1118 + lVar29 * 4);
                      auVar90._0_8_ = *(undefined8 *)(uVar39 + lVar29 * 8);
                      auVar90._12_4_ = 0;
                      auVar48._8_4_ = -(uint)(iVar12 < *(int *)(local_1118 + lVar29 * 4));
                      auVar48._4_4_ = auVar48._8_4_;
                      auVar48._0_4_ = auVar48._8_4_;
                      auVar48._12_4_ = auVar48._8_4_;
                      auVar87 = blendvps(auVar90,auVar77,auVar48);
                      auVar67 = blendvps(auVar77,auVar90,auVar48);
                      auVar49._8_4_ = -(uint)(auVar118._8_4_ < auVar67._8_4_);
                      auVar49._4_4_ = auVar49._8_4_;
                      auVar49._0_4_ = auVar49._8_4_;
                      auVar49._12_4_ = auVar49._8_4_;
                      auVar91 = blendvps(auVar67,auVar118,auVar49);
                      auVar118 = blendvps(auVar118,auVar67,auVar49);
                      auVar50._8_4_ = -(uint)(auVar84._8_4_ < auVar87._8_4_);
                      auVar50._4_4_ = auVar50._8_4_;
                      auVar50._0_4_ = auVar50._8_4_;
                      auVar50._12_4_ = auVar50._8_4_;
                      auVar67 = blendvps(auVar87,auVar84,auVar50);
                      auVar84 = blendvps(auVar84,auVar87,auVar50);
                      auVar51._8_4_ = -(uint)(auVar84._8_4_ < auVar91._8_4_);
                      auVar51._4_4_ = auVar51._8_4_;
                      auVar51._0_4_ = auVar51._8_4_;
                      auVar51._12_4_ = auVar51._8_4_;
                      auVar87 = blendvps(auVar91,auVar84,auVar51);
                      auVar84 = blendvps(auVar84,auVar91,auVar51);
                      *local_1198 = auVar118;
                      local_1198[1] = auVar84;
                      local_1198[2] = auVar87;
                      uVar40 = auVar67._0_8_;
                      local_1198 = local_1198 + 3;
                      fVar94 = local_1138;
                      fVar95 = fStack_1134;
                      fVar96 = fStack_1130;
                      fVar99 = fStack_112c;
                      fVar100 = local_1148;
                      fVar101 = fStack_1144;
                      fVar102 = fStack_1140;
                      fVar103 = fStack_113c;
                    }
                  }
                }
              }
            }
            else {
              iVar27 = 6;
            }
          } while (iVar27 == 0);
        } while (iVar27 != 6);
        local_1188 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_1188 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          uVar37 = 0;
          do {
            lVar29 = uVar37 * 0x50;
            pSVar42 = context->scene;
            ppfVar14 = (pSVar42->vertices).items;
            pfVar15 = ppfVar14[*(uint *)(uVar40 + 0x30 + lVar29)];
            pfVar8 = pfVar15 + *(uint *)(uVar40 + lVar29);
            pfVar1 = pfVar15 + *(uint *)(uVar40 + 0x10 + lVar29);
            pfVar15 = pfVar15 + *(uint *)(uVar40 + 0x20 + lVar29);
            pfVar16 = ppfVar14[*(uint *)(uVar40 + 0x34 + lVar29)];
            pfVar2 = pfVar16 + *(uint *)(uVar40 + 4 + lVar29);
            pfVar3 = pfVar16 + *(uint *)(uVar40 + 0x14 + lVar29);
            pfVar16 = pfVar16 + *(uint *)(uVar40 + 0x24 + lVar29);
            pfVar17 = ppfVar14[*(uint *)(uVar40 + 0x38 + lVar29)];
            pfVar4 = pfVar17 + *(uint *)(uVar40 + 8 + lVar29);
            pfVar5 = pfVar17 + *(uint *)(uVar40 + 0x18 + lVar29);
            pfVar17 = pfVar17 + *(uint *)(uVar40 + 0x28 + lVar29);
            pfVar18 = ppfVar14[*(uint *)(uVar40 + 0x3c + lVar29)];
            pfVar6 = pfVar18 + *(uint *)(uVar40 + 0xc + lVar29);
            pfVar7 = pfVar18 + *(uint *)(uVar40 + 0x1c + lVar29);
            pfVar18 = pfVar18 + *(uint *)(uVar40 + 0x2c + lVar29);
            puVar9 = (undefined8 *)(uVar40 + 0x30 + lVar29);
            local_f88 = *puVar9;
            uStack_f80 = puVar9[1];
            puVar9 = (undefined8 *)(uVar40 + 0x40 + lVar29);
            local_1128 = *puVar9;
            uStack_1120 = puVar9[1];
            fVar138 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar81 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar129 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_1218 = *pfVar8 - fVar138;
            fStack_1214 = *pfVar2 - fVar138;
            fStack_1210 = *pfVar4 - fVar138;
            auStack_120c._0_4_ = *pfVar6 - fVar138;
            local_fa8 = pfVar8[1] - fVar81;
            fStack_fa4 = pfVar2[1] - fVar81;
            fStack_fa0 = pfVar4[1] - fVar81;
            fStack_f9c = pfVar6[1] - fVar81;
            local_f98 = pfVar8[2] - fVar129;
            fStack_f94 = pfVar2[2] - fVar129;
            fStack_f90 = pfVar4[2] - fVar129;
            fStack_f8c = pfVar6[2] - fVar129;
            fVar89 = *pfVar1 - fVar138;
            fVar93 = *pfVar3 - fVar138;
            fVar94 = *pfVar5 - fVar138;
            fVar95 = *pfVar7 - fVar138;
            fVar115 = pfVar1[1] - fVar81;
            fVar119 = pfVar3[1] - fVar81;
            fVar121 = pfVar5[1] - fVar81;
            fVar123 = pfVar7[1] - fVar81;
            fVar96 = pfVar1[2] - fVar129;
            fVar99 = pfVar3[2] - fVar129;
            fVar100 = pfVar5[2] - fVar129;
            fVar101 = pfVar7[2] - fVar129;
            fVar135 = *pfVar15 - fVar138;
            fVar136 = *pfVar16 - fVar138;
            fVar137 = *pfVar17 - fVar138;
            fVar138 = *pfVar18 - fVar138;
            fVar74 = pfVar15[1] - fVar81;
            fVar79 = pfVar16[1] - fVar81;
            fVar80 = pfVar17[1] - fVar81;
            fVar81 = pfVar18[1] - fVar81;
            fVar125 = pfVar15[2] - fVar129;
            fVar127 = pfVar16[2] - fVar129;
            fVar128 = pfVar17[2] - fVar129;
            fVar129 = pfVar18[2] - fVar129;
            fVar102 = fVar135 - local_1218;
            fVar105 = fVar136 - fStack_1214;
            fVar107 = fVar137 - fStack_1210;
            fVar109 = fVar138 - (float)auStack_120c._0_4_;
            fVar111 = fVar74 - local_fa8;
            fVar112 = fVar79 - fStack_fa4;
            fVar113 = fVar80 - fStack_fa0;
            fVar114 = fVar81 - fStack_f9c;
            local_fb8 = fVar125 - local_f98;
            fStack_fb4 = fVar127 - fStack_f94;
            fStack_fb0 = fVar128 - fStack_f90;
            fStack_fac = fVar129 - fStack_f8c;
            local_11d8 = fVar111;
            fStack_11d4 = fVar112;
            fStack_11d0 = fVar113;
            fStack_11cc = fVar114;
            local_11c8._4_4_ = fVar105;
            local_11c8._0_4_ = fVar102;
            fStack_11c0 = fVar107;
            fStack_11bc = fVar109;
            fVar64 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar82 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1234 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar43 = (fVar111 * (fVar125 + local_f98) - local_fb8 * (fVar74 + local_fa8)) * fVar64 +
                     (local_fb8 * (fVar135 + local_1218) - (fVar125 + local_f98) * fVar102) * fVar82
                     + ((fVar74 + local_fa8) * fVar102 - (fVar135 + local_1218) * fVar111) *
                       fStack_1234;
            fVar60 = (fVar112 * (fVar127 + fStack_f94) - fStack_fb4 * (fVar79 + fStack_fa4)) *
                     fVar64 + (fStack_fb4 * (fVar136 + fStack_1214) -
                              (fVar127 + fStack_f94) * fVar105) * fVar82 +
                              ((fVar79 + fStack_fa4) * fVar105 - (fVar136 + fStack_1214) * fVar112)
                              * fStack_1234;
            auVar52._0_8_ = CONCAT44(fVar60,fVar43);
            auVar52._8_4_ =
                 (fVar113 * (fVar128 + fStack_f90) - fStack_fb0 * (fVar80 + fStack_fa0)) * fVar64 +
                 (fStack_fb0 * (fVar137 + fStack_1210) - (fVar128 + fStack_f90) * fVar107) * fVar82
                 + ((fVar80 + fStack_fa0) * fVar107 - (fVar137 + fStack_1210) * fVar113) *
                   fStack_1234;
            auVar52._12_4_ =
                 (fVar114 * (fVar129 + fStack_f8c) - fStack_fac * (fVar81 + fStack_f9c)) * fVar64 +
                 (fStack_fac * (fVar138 + (float)auStack_120c._0_4_) -
                 (fVar129 + fStack_f8c) * fVar109) * fVar82 +
                 ((fVar81 + fStack_f9c) * fVar109 - (fVar138 + (float)auStack_120c._0_4_) * fVar114)
                 * fStack_1234;
            fVar130 = local_fa8 - fVar115;
            fVar132 = fStack_fa4 - fVar119;
            fVar133 = fStack_fa0 - fVar121;
            fVar134 = fStack_f9c - fVar123;
            fVar65 = local_f98 - fVar96;
            fVar71 = fStack_f94 - fVar99;
            fVar72 = fStack_f90 - fVar100;
            fVar73 = fStack_f8c - fVar101;
            fVar103 = local_1218 - fVar89;
            fVar106 = fStack_1214 - fVar93;
            fVar108 = fStack_1210 - fVar94;
            fVar110 = (float)auStack_120c._0_4_ - fVar95;
            local_fc8 = (fVar130 * (local_f98 + fVar96) - fVar65 * (local_fa8 + fVar115)) * fVar64 +
                        (fVar65 * (local_1218 + fVar89) - (local_f98 + fVar96) * fVar103) * fVar82 +
                        ((local_fa8 + fVar115) * fVar103 - (local_1218 + fVar89) * fVar130) *
                        fStack_1234;
            fStack_fc4 = (fVar132 * (fStack_f94 + fVar99) - fVar71 * (fStack_fa4 + fVar119)) *
                         fVar64 + (fVar71 * (fStack_1214 + fVar93) - (fStack_f94 + fVar99) * fVar106
                                  ) * fVar82 +
                                  ((fStack_fa4 + fVar119) * fVar106 -
                                  (fStack_1214 + fVar93) * fVar132) * fStack_1234;
            fStack_fc0 = (fVar133 * (fStack_f90 + fVar100) - fVar72 * (fStack_fa0 + fVar121)) *
                         fVar64 + (fVar72 * (fStack_1210 + fVar94) -
                                  (fStack_f90 + fVar100) * fVar108) * fVar82 +
                                  ((fStack_fa0 + fVar121) * fVar108 -
                                  (fStack_1210 + fVar94) * fVar133) * fStack_1234;
            fStack_fbc = (fVar134 * (fStack_f8c + fVar101) - fVar73 * (fStack_f9c + fVar123)) *
                         fVar64 + (fVar73 * ((float)auStack_120c._0_4_ + fVar95) -
                                  (fStack_f8c + fVar101) * fVar110) * fVar82 +
                                  ((fStack_f9c + fVar123) * fVar110 -
                                  ((float)auStack_120c._0_4_ + fVar95) * fVar134) * fStack_1234;
            local_fd8._0_4_ = fVar89 - fVar135;
            local_fd8._4_4_ = fVar93 - fVar136;
            local_fd8._8_4_ = fVar94 - fVar137;
            local_fd8._12_4_ = fVar95 - fVar138;
            local_11d8 = fVar115 - fVar74;
            fStack_11d4 = fVar119 - fVar79;
            fStack_11d0 = fVar121 - fVar80;
            fStack_11cc = fVar123 - fVar81;
            fVar116 = fVar96 - fVar125;
            fVar120 = fVar99 - fVar127;
            fVar122 = fVar100 - fVar128;
            fVar124 = fVar101 - fVar129;
            local_123c._4_4_ = fStack_1234;
            uStack_1230 = fStack_1234;
            auStack_122c._0_4_ = fStack_1234;
            local_11b8._8_4_ = auVar52._8_4_;
            local_11b8._0_8_ = auVar52._0_8_;
            local_11b8._12_4_ = auVar52._12_4_;
            auVar70._0_4_ =
                 (local_11d8 * (fVar125 + fVar96) - fVar116 * (fVar74 + fVar115)) * fVar64 +
                 (fVar116 * (fVar135 + fVar89) - (fVar125 + fVar96) * local_fd8._0_4_) * fVar82 +
                 ((fVar74 + fVar115) * local_fd8._0_4_ - (fVar135 + fVar89) * local_11d8) *
                 fStack_1234;
            auVar70._4_4_ =
                 (fStack_11d4 * (fVar127 + fVar99) - fVar120 * (fVar79 + fVar119)) * fVar64 +
                 (fVar120 * (fVar136 + fVar93) - (fVar127 + fVar99) * local_fd8._4_4_) * fVar82 +
                 ((fVar79 + fVar119) * local_fd8._4_4_ - (fVar136 + fVar93) * fStack_11d4) *
                 fStack_1234;
            auVar70._8_4_ =
                 (fStack_11d0 * (fVar128 + fVar100) - fVar122 * (fVar80 + fVar121)) * fVar64 +
                 (fVar122 * (fVar137 + fVar94) - (fVar128 + fVar100) * local_fd8._8_4_) * fVar82 +
                 ((fVar80 + fVar121) * local_fd8._8_4_ - (fVar137 + fVar94) * fStack_11d0) *
                 fStack_1234;
            auVar70._12_4_ =
                 (fStack_11cc * (fVar129 + fVar101) - fVar124 * (fVar81 + fVar123)) * fVar64 +
                 (fVar124 * (fVar138 + fVar95) - (fVar129 + fVar101) * local_fd8._12_4_) * fVar82 +
                 ((fVar81 + fVar123) * local_fd8._12_4_ - (fVar138 + fVar95) * fStack_11cc) *
                 fStack_1234;
            local_11c8._0_4_ = fVar43 + local_fc8 + auVar70._0_4_;
            local_11c8._4_4_ = fVar60 + fStack_fc4 + auVar70._4_4_;
            fStack_11c0 = auVar52._8_4_ + fStack_fc0 + auVar70._8_4_;
            fStack_11bc = auVar52._12_4_ + fStack_fbc + auVar70._12_4_;
            auVar23._4_4_ = fStack_fc4;
            auVar23._0_4_ = local_fc8;
            auVar23._8_4_ = fStack_fc0;
            auVar23._12_4_ = fStack_fbc;
            auVar118 = minps(auVar52,auVar23);
            auVar118 = minps(auVar118,auVar70);
            auVar24._4_4_ = fStack_fc4;
            auVar24._0_4_ = local_fc8;
            auVar24._8_4_ = fStack_fc0;
            auVar24._12_4_ = fStack_fbc;
            auVar117 = maxps(local_11b8,auVar24);
            auVar117 = maxps(auVar117,auVar70);
            fVar138 = ABS((float)local_11c8._0_4_) * 1.1920929e-07;
            fVar81 = ABS((float)local_11c8._4_4_) * 1.1920929e-07;
            fVar129 = ABS(fStack_11c0) * 1.1920929e-07;
            fVar74 = ABS(fStack_11bc) * 1.1920929e-07;
            local_1271 = 0;
            local_10e8 = &local_1271;
            auVar97._0_4_ =
                 -(uint)(auVar117._0_4_ <= fVar138 || -fVar138 <= auVar118._0_4_) & local_fe8;
            auVar97._4_4_ =
                 -(uint)(auVar117._4_4_ <= fVar81 || -fVar81 <= auVar118._4_4_) & uStack_fe4;
            auVar97._8_4_ =
                 -(uint)(auVar117._8_4_ <= fVar129 || -fVar129 <= auVar118._8_4_) & uStack_fe0;
            auVar97._12_4_ =
                 -(uint)(auVar117._12_4_ <= fVar74 || -fVar74 <= auVar118._12_4_) & uStack_fdc;
            iVar27 = movmskps((int)lVar29,auVar97);
            if (iVar27 != 0) {
              auVar131._0_4_ = fVar130 * fVar116 - fVar65 * local_11d8;
              auVar131._4_4_ = fVar132 * fVar120 - fVar71 * fStack_11d4;
              auVar131._8_4_ = fVar133 * fVar122 - fVar72 * fStack_11d0;
              auVar131._12_4_ = fVar134 * fVar124 - fVar73 * fStack_11cc;
              auVar53._4_4_ = -(uint)(ABS(fStack_fb4 * fVar132) < ABS(fVar71 * fStack_11d4));
              auVar53._0_4_ = -(uint)(ABS(local_fb8 * fVar130) < ABS(fVar65 * local_11d8));
              auVar53._8_4_ = -(uint)(ABS(fStack_fb0 * fVar133) < ABS(fVar72 * fStack_11d0));
              auVar53._12_4_ = -(uint)(ABS(fStack_fac * fVar134) < ABS(fVar73 * fStack_11cc));
              auVar22._4_4_ = fVar112 * fVar71 - fStack_fb4 * fVar132;
              auVar22._0_4_ = fVar111 * fVar65 - local_fb8 * fVar130;
              auVar22._8_4_ = fVar113 * fVar72 - fStack_fb0 * fVar133;
              auVar22._12_4_ = fVar114 * fVar73 - fStack_fac * fVar134;
              local_1098 = blendvps(auVar131,auVar22,auVar53);
              auVar92._0_4_ = fVar65 * local_fd8._0_4_ - fVar103 * fVar116;
              auVar92._4_4_ = fVar71 * local_fd8._4_4_ - fVar106 * fVar120;
              auVar92._8_4_ = fVar72 * local_fd8._8_4_ - fVar108 * fVar122;
              auVar92._12_4_ = fVar73 * local_fd8._12_4_ - fVar110 * fVar124;
              auVar54._4_4_ = -(uint)(ABS(fVar105 * fVar71) < ABS(fVar106 * fVar120));
              auVar54._0_4_ = -(uint)(ABS(fVar102 * fVar65) < ABS(fVar103 * fVar116));
              auVar54._8_4_ = -(uint)(ABS(fVar107 * fVar72) < ABS(fVar108 * fVar122));
              auVar54._12_4_ = -(uint)(ABS(fVar109 * fVar73) < ABS(fVar110 * fVar124));
              auVar25._4_4_ = fStack_fb4 * fVar106 - fVar105 * fVar71;
              auVar25._0_4_ = local_fb8 * fVar103 - fVar102 * fVar65;
              auVar25._8_4_ = fStack_fb0 * fVar108 - fVar107 * fVar72;
              auVar25._12_4_ = fStack_fac * fVar110 - fVar109 * fVar73;
              local_1088 = blendvps(auVar92,auVar25,auVar54);
              auVar88._0_4_ = fVar102 * fVar130 - fVar111 * fVar103;
              auVar88._4_4_ = fVar105 * fVar132 - fVar112 * fVar106;
              auVar88._8_4_ = fVar107 * fVar133 - fVar113 * fVar108;
              auVar88._12_4_ = fVar109 * fVar134 - fVar114 * fVar110;
              auVar104._0_4_ = fVar103 * local_11d8 - fVar130 * local_fd8._0_4_;
              auVar104._4_4_ = fVar106 * fStack_11d4 - fVar132 * local_fd8._4_4_;
              auVar104._8_4_ = fVar108 * fStack_11d0 - fVar133 * local_fd8._8_4_;
              auVar104._12_4_ = fVar110 * fStack_11cc - fVar134 * local_fd8._12_4_;
              auVar55._4_4_ = -(uint)(ABS(fVar112 * fVar106) < ABS(fVar132 * local_fd8._4_4_));
              auVar55._0_4_ = -(uint)(ABS(fVar111 * fVar103) < ABS(fVar130 * local_fd8._0_4_));
              auVar55._8_4_ = -(uint)(ABS(fVar113 * fVar108) < ABS(fVar133 * local_fd8._8_4_));
              auVar55._12_4_ = -(uint)(ABS(fVar114 * fVar110) < ABS(fVar134 * local_fd8._12_4_));
              local_1078 = blendvps(auVar104,auVar88,auVar55);
              fVar138 = fVar64 * local_1098._0_4_ +
                        fVar82 * local_1088._0_4_ + fStack_1234 * local_1078._0_4_;
              fVar81 = fVar64 * local_1098._4_4_ +
                       fVar82 * local_1088._4_4_ + fStack_1234 * local_1078._4_4_;
              fVar129 = fVar64 * local_1098._8_4_ +
                        fVar82 * local_1088._8_4_ + fStack_1234 * local_1078._8_4_;
              fVar64 = fVar64 * local_1098._12_4_ +
                       fVar82 * local_1088._12_4_ + fStack_1234 * local_1078._12_4_;
              auVar61._0_4_ = fVar138 + fVar138;
              auVar61._4_4_ = fVar81 + fVar81;
              auVar61._8_4_ = fVar129 + fVar129;
              auVar61._12_4_ = fVar64 + fVar64;
              auVar56._0_4_ = local_f98 * local_1078._0_4_;
              auVar56._4_4_ = fStack_f94 * local_1078._4_4_;
              auVar56._8_4_ = fStack_f90 * local_1078._8_4_;
              auVar56._12_4_ = fStack_f8c * local_1078._12_4_;
              fVar82 = local_1218 * local_1098._0_4_ + local_fa8 * local_1088._0_4_ + auVar56._0_4_;
              fVar65 = fStack_1214 * local_1098._4_4_ +
                       fStack_fa4 * local_1088._4_4_ + auVar56._4_4_;
              fVar71 = fStack_1210 * local_1098._8_4_ +
                       fStack_fa0 * local_1088._8_4_ + auVar56._8_4_;
              fVar72 = (float)auStack_120c._0_4_ * local_1098._12_4_ +
                       fStack_f9c * local_1088._12_4_ + auVar56._12_4_;
              auVar118 = rcpps(auVar56,auVar61);
              fVar138 = auVar118._0_4_;
              fVar81 = auVar118._4_4_;
              fVar129 = auVar118._8_4_;
              fVar64 = auVar118._12_4_;
              local_1258._0_4_ =
                   ((1.0 - auVar61._0_4_ * fVar138) * fVar138 + fVar138) * (fVar82 + fVar82);
              local_1258._4_4_ =
                   ((1.0 - auVar61._4_4_ * fVar81) * fVar81 + fVar81) * (fVar65 + fVar65);
              local_1258._8_4_ =
                   ((1.0 - auVar61._8_4_ * fVar129) * fVar129 + fVar129) * (fVar71 + fVar71);
              local_1258._12_4_ =
                   ((1.0 - auVar61._12_4_ * fVar64) * fVar64 + fVar64) * (fVar72 + fVar72);
              fVar138 = (ray->super_RayK<1>).tfar;
              fVar81 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar57._4_4_ = -(uint)(fVar81 <= local_1258._4_4_);
              auVar57._0_4_ = -(uint)(fVar81 <= local_1258._0_4_);
              auVar57._8_4_ = -(uint)(fVar81 <= local_1258._8_4_);
              auVar57._12_4_ = -(uint)(fVar81 <= local_1258._12_4_);
              auVar62._0_4_ =
                   (int)((uint)(auVar61._0_4_ != 0.0 &&
                               (local_1258._0_4_ <= fVar138 && fVar81 <= local_1258._0_4_)) *
                        -0x80000000) >> 0x1f;
              auVar62._4_4_ =
                   (int)((uint)(auVar61._4_4_ != 0.0 &&
                               (local_1258._4_4_ <= fVar138 && fVar81 <= local_1258._4_4_)) *
                        -0x80000000) >> 0x1f;
              auVar62._8_4_ =
                   (int)((uint)(auVar61._8_4_ != 0.0 &&
                               (local_1258._8_4_ <= fVar138 && fVar81 <= local_1258._8_4_)) *
                        -0x80000000) >> 0x1f;
              auVar62._12_4_ =
                   (int)((uint)(auVar61._12_4_ != 0.0 &&
                               (local_1258._12_4_ <= fVar138 && fVar81 <= local_1258._12_4_)) *
                        -0x80000000) >> 0x1f;
              auVar63 = auVar62 & auVar97;
              iVar27 = movmskps(iVar27,auVar63);
              if (iVar27 != 0) {
                local_1118._8_4_ = auVar52._8_4_;
                local_1118._0_8_ = auVar52._0_8_;
                fStack_110c = auVar52._12_4_;
                local_1108 = local_fc8;
                fStack_1104 = fStack_fc4;
                fStack_1100 = fStack_fc0;
                fStack_10fc = fStack_fbc;
                local_10f8 = _local_11c8;
                local_10d8 = auVar63;
                local_10a8 = local_1258;
                stack0xffffffffffffedd8 = auVar63;
                auVar118 = rcpps(auVar57,_local_11c8);
                fVar138 = auVar118._0_4_;
                fVar81 = auVar118._4_4_;
                fVar129 = auVar118._8_4_;
                fVar64 = auVar118._12_4_;
                fVar138 = (float)(-(uint)(1e-18 <= ABS((float)local_11c8._0_4_)) &
                                 (uint)(((float)DAT_01feca10 - (float)local_11c8._0_4_ * fVar138) *
                                        fVar138 + fVar138));
                fVar81 = (float)(-(uint)(1e-18 <= ABS((float)local_11c8._4_4_)) &
                                (uint)((DAT_01feca10._4_4_ - (float)local_11c8._4_4_ * fVar81) *
                                       fVar81 + fVar81));
                fVar129 = (float)(-(uint)(1e-18 <= ABS(fStack_11c0)) &
                                 (uint)((DAT_01feca10._8_4_ - fStack_11c0 * fVar129) * fVar129 +
                                       fVar129));
                fVar64 = (float)(-(uint)(1e-18 <= ABS(fStack_11bc)) &
                                (uint)((DAT_01feca10._12_4_ - fStack_11bc * fVar64) * fVar64 +
                                      fVar64));
                auVar98._0_4_ = fVar43 * fVar138;
                auVar98._4_4_ = fVar60 * fVar81;
                auVar98._8_4_ = auVar52._8_4_ * fVar129;
                auVar98._12_4_ = auVar52._12_4_ * fVar64;
                local_10c8 = minps(auVar98,_DAT_01feca10);
                auVar126._0_4_ = fVar138 * local_fc8;
                auVar126._4_4_ = fVar81 * fStack_fc4;
                auVar126._8_4_ = fVar129 * fStack_fc0;
                auVar126._12_4_ = fVar64 * fStack_fbc;
                local_10b8 = minps(auVar126,_DAT_01feca10);
                auVar117 = blendvps(_DAT_01feb9f0,local_1258,auVar63);
                auVar78._4_4_ = auVar117._0_4_;
                auVar78._0_4_ = auVar117._4_4_;
                auVar78._8_4_ = auVar117._12_4_;
                auVar78._12_4_ = auVar117._8_4_;
                auVar118 = minps(auVar78,auVar117);
                auVar58._0_8_ = auVar118._8_8_;
                auVar58._8_4_ = auVar118._0_4_;
                auVar58._12_4_ = auVar118._4_4_;
                auVar118 = minps(auVar58,auVar118);
                auVar59._0_8_ =
                     CONCAT44(-(uint)(auVar118._4_4_ == auVar117._4_4_) & auVar63._4_4_,
                              -(uint)(auVar118._0_4_ == auVar117._0_4_) & auVar63._0_4_);
                auVar59._8_4_ = -(uint)(auVar118._8_4_ == auVar117._8_4_) & auVar63._8_4_;
                auVar59._12_4_ = -(uint)(auVar118._12_4_ == auVar117._12_4_) & auVar63._12_4_;
                iVar27 = movmskps(iVar27,auVar59);
                if (iVar27 != 0) {
                  auVar63._8_4_ = auVar59._8_4_;
                  auVar63._0_8_ = auVar59._0_8_;
                  auVar63._12_4_ = auVar59._12_4_;
                }
                uVar38 = movmskps(iVar27,auVar63);
                uVar30 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar38);
                pRVar32 = (RayHit *)0x0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> (long)pRVar32 & 1) == 0;
                      pRVar32 = (RayHit *)((long)(pRVar32->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                local_1190 = pSVar42;
                do {
                  uVar28 = *(uint *)((long)&local_f88 + (long)pRVar32 * 4);
                  pGVar19 = (pSVar42->geometries).items[uVar28].ptr;
                  if ((pGVar19->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(auStack_122c + (long)pRVar32 * 4 + 4) = 0;
                  }
                  else {
                    pRVar20 = context->args;
                    if ((pRVar20->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar138 = *(float *)(local_10c8 + (long)pRVar32 * 4);
                      fVar81 = *(float *)(local_10b8 + (long)pRVar32 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pRVar32 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1098 + (long)pRVar32 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1088 + (long)pRVar32 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1078 + (long)pRVar32 * 4);
                      ray->u = fVar138;
                      ray->v = fVar81;
                      ray->primID = *(uint *)((long)&local_1128 + (long)pRVar32 * 4);
                      ray->geomID = uVar28;
                      pRVar21 = context->user;
                      ray->instID[0] = pRVar21->instID[0];
                      ray->instPrimID[0] = pRVar21->instPrimID[0];
                      break;
                    }
                    local_11f8 = context->user;
                    local_1178 = *(float *)(local_1098 + (long)pRVar32 * 4);
                    local_1174 = *(undefined4 *)(local_1088 + (long)pRVar32 * 4);
                    local_1170 = *(undefined4 *)(local_1078 + (long)pRVar32 * 4);
                    local_116c = *(undefined4 *)(local_10c8 + (long)pRVar32 * 4);
                    local_1168 = *(undefined4 *)(local_10b8 + (long)pRVar32 * 4);
                    local_1164 = *(undefined4 *)((long)&local_1128 + (long)pRVar32 * 4);
                    local_1160 = uVar28;
                    local_115c = local_11f8->instID[0];
                    local_1158 = local_11f8->instPrimID[0];
                    local_1218 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_10a8 + (long)pRVar32 * 4);
                    local_123c._0_4_ = -NAN;
                    auStack_120c._4_8_ = (RayHit *)local_123c;
                    local_1200 = pGVar19->userPtr;
                    local_11f0 = ray;
                    local_11e8 = &local_1178;
                    local_11e0 = 1;
                    if ((pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       (unique0x1000253a = uVar37,
                       (*pGVar19->intersectionFilterN)
                                 ((RTCFilterFunctionNArguments *)(auStack_120c + 4)),
                       uVar35 = local_1270, context = local_1248, uVar37 = stack0xffffffffffffedc8,
                       *(int *)auStack_120c._4_8_ != 0)) {
                      if (pRVar20->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar20->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar19->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar20->filter)((RTCFilterFunctionNArguments *)(auStack_120c + 4));
                          uVar35 = local_1270;
                          context = local_1248;
                        }
                        if (*(int *)auStack_120c._4_8_ == 0) goto LAB_00e75739;
                      }
                      (local_11f0->Ng).field_0.field_0.x = *local_11e8;
                      (local_11f0->Ng).field_0.field_0.y = local_11e8[1];
                      (local_11f0->Ng).field_0.field_0.z = local_11e8[2];
                      local_11f0->u = local_11e8[3];
                      local_11f0->v = local_11e8[4];
                      local_11f0->primID = (uint)local_11e8[5];
                      local_11f0->geomID = (uint)local_11e8[6];
                      local_11f0->instID[0] = (uint)local_11e8[7];
                      local_11f0->instPrimID[0] = (uint)local_11e8[8];
                      pRVar31 = local_11f0;
                    }
                    else {
LAB_00e75739:
                      (ray->super_RayK<1>).tfar = local_1218;
                      pRVar31 = (RayHit *)auStack_120c._4_8_;
                    }
                    uVar28 = (uint)pRVar31;
                    *(undefined4 *)(auStack_122c + (long)pRVar32 * 4 + 4) = 0;
                    fVar138 = (ray->super_RayK<1>).tfar;
                    uStack_1224 = -(uint)(local_1258._4_4_ <= fVar138) & uStack_1224;
                    auStack_122c._4_4_ = -(uint)(local_1258._0_4_ <= fVar138) & auStack_122c._4_4_;
                    uStack_1220 = -(uint)(local_1258._8_4_ <= fVar138) & uStack_1220;
                    fStack_121c = (float)(-(uint)(local_1258._12_4_ <= fVar138) & (uint)fStack_121c)
                    ;
                    pSVar42 = local_1190;
                  }
                  iVar27 = movmskps(uVar28,stack0xffffffffffffedd8);
                  if (iVar27 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  pRVar32 = (RayHit *)auStack_120c._4_8_;
                  uVar35 = local_1270;
                  context = local_1248;
                } while( true );
              }
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 != local_1188);
        }
        fVar138 = (ray->super_RayK<1>).tfar;
        auVar117._4_4_ = fVar138;
        auVar117._0_4_ = fVar138;
        auVar117._8_4_ = fVar138;
        auVar117._12_4_ = fVar138;
        uVar30 = local_11a0;
        uVar33 = local_1260;
        uVar34 = local_1268;
        uVar41 = local_11a8;
        fVar138 = local_1008;
        fVar81 = fStack_1004;
        fVar129 = fStack_1000;
        fVar64 = fStack_ffc;
        fVar82 = local_1048;
        fVar43 = fStack_1044;
        fVar60 = fStack_1040;
        fVar65 = fStack_103c;
        fVar71 = local_1058;
        fVar72 = fStack_1054;
        fVar73 = fStack_1050;
        fVar74 = fStack_104c;
        fVar79 = local_1068;
        fVar80 = fStack_1064;
        fVar89 = fStack_1060;
        fVar93 = fStack_105c;
        fVar94 = local_1138;
        fVar95 = fStack_1134;
        fVar96 = fStack_1130;
        fVar99 = fStack_112c;
        fVar100 = local_1148;
        fVar101 = fStack_1144;
        fVar102 = fStack_1140;
        fVar103 = fStack_113c;
        fVar105 = local_ff8;
        fVar106 = fStack_ff4;
        fVar107 = fStack_ff0;
        fVar108 = fStack_fec;
        fVar109 = local_1018;
        fVar110 = fStack_1014;
        fVar111 = fStack_1010;
        fVar112 = fStack_100c;
        fVar113 = local_1028;
        fVar114 = fStack_1024;
        fVar115 = fStack_1020;
        fVar116 = fStack_101c;
        fVar119 = local_1038;
        fVar120 = fStack_1034;
        fVar121 = fStack_1030;
        fVar122 = fStack_102c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }